

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

nng_err nni_http_handler_init_directory(nni_http_handler **hpp,char *uri,char *path)

{
  nng_err nVar1;
  nng_http_handler *in_RAX;
  undefined8 *dat;
  char *pcVar2;
  nng_http_handler *local_38;
  nni_http_handler *h;
  
  local_38 = in_RAX;
  dat = (undefined8 *)nni_zalloc(0x18);
  nVar1 = NNG_ENOMEM;
  if (dat != (undefined8 *)0x0) {
    pcVar2 = nng_strdup(path);
    dat[1] = pcVar2;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = nng_strdup(uri);
      *dat = pcVar2;
      if ((pcVar2 != (char *)0x0) &&
         (nVar1 = nni_http_handler_init(&local_38,uri,http_handle_dir), nVar1 == NNG_OK)) {
        nng_http_handler_set_tree(local_38);
        nng_http_handler_collect_body(local_38,true,0);
        nng_http_handler_set_data(local_38,dat,http_file_free);
        *hpp = local_38;
        return NNG_OK;
      }
    }
    http_file_free(dat);
  }
  return nVar1;
}

Assistant:

nng_err
nni_http_handler_init_directory(
    nni_http_handler **hpp, const char *uri, const char *path)
{
	http_file        *hf;
	nni_http_handler *h;
	nng_err           rv;

	if ((hf = NNI_ALLOC_STRUCT(hf)) == NULL) {
		return (NNG_ENOMEM);
	}
	if (((hf->path = nng_strdup(path)) == NULL) ||
	    ((hf->base = nng_strdup(uri)) == NULL)) {
		http_file_free(hf);
		return (NNG_ENOMEM);
	}

	if ((rv = nni_http_handler_init(&h, uri, http_handle_dir)) != 0) {
		http_file_free(hf);
		return (rv);
	}
	// We don't permit a body for getting a file.
	nng_http_handler_set_tree(h);
	nng_http_handler_collect_body(h, true, 0);
	nng_http_handler_set_data(h, hf, http_file_free);

	*hpp = h;
	return (NNG_OK);
}